

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int EXRLayers(char *filename,char ***layer_names,int *num_layers,char **err)

{
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  char **ppcVar4;
  ulong uVar5;
  pointer pbVar6;
  long lVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layer_vec;
  EXRVersion exr_version;
  EXRHeader exr_header;
  undefined1 local_e8 [36];
  EXRVersion local_c4;
  EXRHeader local_b0;
  
  memset(&local_b0,0,0x88);
  iVar2 = ParseEXRVersionFromFile(&local_c4,filename);
  if (iVar2 == 0) {
    if (local_c4.non_image == 0 && local_c4.multipart == 0) {
      iVar2 = ParseEXRHeaderFromFile(&local_b0,&local_c4,filename,err);
      if (iVar2 == 0) {
        local_e8._0_8_ = (pointer)0x0;
        local_e8._8_8_ = (pointer)0x0;
        local_e8._16_8_ = (pointer)0x0;
        tinyexr::GetLayers(&local_b0,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_e8);
        uVar1 = local_e8._8_8_;
        pbVar6 = (pointer)local_e8._0_8_;
        *num_layers = (int)((ulong)(local_e8._8_8_ - local_e8._0_8_) >> 5);
        ppcVar4 = (char **)malloc((long)(local_e8._8_8_ - local_e8._0_8_) >> 2);
        *layer_names = ppcVar4;
        if ((pointer)uVar1 != pbVar6) {
          lVar7 = 0;
          uVar5 = 0;
          do {
            pcVar3 = strdup(*(char **)((long)&(pbVar6->_M_dataplus)._M_p + lVar7));
            (*layer_names)[uVar5] = pcVar3;
            uVar5 = uVar5 + 1;
            lVar7 = lVar7 + 0x20;
            pbVar6 = (pointer)local_e8._0_8_;
          } while (uVar5 < (ulong)((long)(local_e8._8_8_ - local_e8._0_8_) >> 5));
        }
        FreeEXRHeader(&local_b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_e8);
        iVar2 = 0;
      }
      else {
        FreeEXRHeader(&local_b0);
      }
    }
    else {
      local_e8._0_8_ = (pointer)(local_e8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,
                 "Loading multipart or DeepImage is not supported  in LoadEXR() API","");
      uVar1 = local_e8._0_8_;
      if (err != (char **)0x0) {
        pcVar3 = strdup((char *)local_e8._0_8_);
        *err = pcVar3;
      }
      if ((pointer)uVar1 != (pointer)(local_e8 + 0x10)) {
        operator_delete((void *)uVar1,(ulong)((long)&((_Alloc_hider *)local_e8._16_8_)->_M_p + 1));
      }
      iVar2 = -4;
    }
  }
  else {
    local_e8._0_8_ = (pointer)(local_e8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Invalid EXR header.","");
    uVar1 = local_e8._0_8_;
    if (err != (char **)0x0) {
      pcVar3 = strdup((char *)local_e8._0_8_);
      *err = pcVar3;
    }
    if ((pointer)uVar1 != (pointer)(local_e8 + 0x10)) {
      operator_delete((void *)uVar1,(ulong)((long)&((_Alloc_hider *)local_e8._16_8_)->_M_p + 1));
    }
  }
  return iVar2;
}

Assistant:

int EXRLayers(const char *filename, const char **layer_names[], int *num_layers, const char **err) {
  EXRVersion exr_version;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      tinyexr::SetErrorMessage("Invalid EXR header.", err);
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      tinyexr::SetErrorMessage(
        "Loading multipart or DeepImage is not supported  in LoadEXR() API",
        err);
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
  if (ret != TINYEXR_SUCCESS) {
    FreeEXRHeader(&exr_header);
    return ret;
  }

  std::vector<std::string> layer_vec;
  tinyexr::GetLayers(exr_header, layer_vec);

  (*num_layers) = int(layer_vec.size());
  (*layer_names) = static_cast<const char **>(
    malloc(sizeof(const char *) * static_cast<size_t>(layer_vec.size())));
  for (size_t c = 0; c < static_cast<size_t>(layer_vec.size()); c++) {
#ifdef _MSC_VER
    (*layer_names)[c] = _strdup(layer_vec[c].c_str());
#else
    (*layer_names)[c] = strdup(layer_vec[c].c_str());
#endif
  }

  FreeEXRHeader(&exr_header);
  return TINYEXR_SUCCESS;
}